

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O3

void Unit_Test::generateRoi
               (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                *image,vector<unsigned_int,_std::allocator<unsigned_int>_> *x,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *y,uint32_t *width,
               uint32_t *height)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  imageSize;
  allocator_type local_49;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_48;
  undefined1 auVar5 [32];
  
  this = &local_48;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(this,((long)(image->
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(image->
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
           &local_49);
  lVar4 = (long)(image->
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(image->
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar13 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar14 = vpbroadcastq_avx512f();
    lVar4 = (lVar4 >> 3) * -0x3333333333333333;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    uVar3 = lVar4 + 0xfU & 0xfffffffffffffff0;
    auVar15 = vpbroadcastq_avx512f();
    do {
      auVar16 = vpmullq_avx512dq(auVar10,auVar12);
      auVar17 = vpmullq_avx512dq(auVar11,auVar12);
      uVar1 = vpcmpuq_avx512f(auVar10,auVar15,2);
      uVar2 = vpcmpuq_avx512f(auVar11,auVar15,2);
      uVar3 = uVar3 - 0x10;
      vpaddq_avx512f(auVar14,auVar16);
      vpaddq_avx512f(auVar14,auVar17);
      auVar5 = vpgatherqd_avx512f((this->
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
      auVar6._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * auVar5._4_4_;
      auVar6._0_4_ = (uint)((byte)uVar1 & 1) * auVar5._0_4_;
      auVar6._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * auVar5._8_4_;
      auVar6._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * auVar5._12_4_;
      auVar6._16_4_ = (uint)((byte)(uVar1 >> 4) & 1) * auVar5._16_4_;
      auVar6._20_4_ = (uint)((byte)(uVar1 >> 5) & 1) * auVar5._20_4_;
      auVar6._24_4_ = (uint)((byte)(uVar1 >> 6) & 1) * auVar5._24_4_;
      auVar6._28_4_ = (uint)(byte)(uVar1 >> 7) * auVar5._28_4_;
      auVar5 = vpgatherqd_avx512f(*(undefined8 *)(lVar4 + 7));
      auVar7._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar5._4_4_;
      auVar7._0_4_ = (uint)((byte)uVar2 & 1) * auVar5._0_4_;
      auVar7._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar5._8_4_;
      auVar7._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar5._12_4_;
      auVar7._16_4_ = (uint)((byte)(uVar2 >> 4) & 1) * auVar5._16_4_;
      auVar7._20_4_ = (uint)((byte)(uVar2 >> 5) & 1) * auVar5._20_4_;
      auVar7._24_4_ = (uint)((byte)(uVar2 >> 6) & 1) * auVar5._24_4_;
      auVar7._28_4_ = (uint)(byte)(uVar2 >> 7) * auVar5._28_4_;
      auVar5 = vpgatherqd_avx512f(*(undefined8 *)
                                   ((long)&(this->
                                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish + 4));
      auVar8._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * auVar5._4_4_;
      auVar8._0_4_ = (uint)((byte)uVar1 & 1) * auVar5._0_4_;
      auVar8._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * auVar5._8_4_;
      auVar8._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * auVar5._12_4_;
      auVar8._16_4_ = (uint)((byte)(uVar1 >> 4) & 1) * auVar5._16_4_;
      auVar8._20_4_ = (uint)((byte)(uVar1 >> 5) & 1) * auVar5._20_4_;
      auVar8._24_4_ = (uint)((byte)(uVar1 >> 6) & 1) * auVar5._24_4_;
      auVar8._28_4_ = (uint)(byte)(uVar1 >> 7) * auVar5._28_4_;
      auVar5 = vpgatherqd_avx512f(*(undefined8 *)(lVar4 + 0xb));
      auVar9._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar5._4_4_;
      auVar9._0_4_ = (uint)((byte)uVar2 & 1) * auVar5._0_4_;
      auVar9._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar5._8_4_;
      auVar9._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar5._12_4_;
      auVar9._16_4_ = (uint)((byte)(uVar2 >> 4) & 1) * auVar5._16_4_;
      auVar9._20_4_ = (uint)((byte)(uVar2 >> 5) & 1) * auVar5._20_4_;
      auVar9._24_4_ = (uint)((byte)(uVar2 >> 6) & 1) * auVar5._24_4_;
      auVar9._28_4_ = (uint)(byte)(uVar2 >> 7) * auVar5._28_4_;
      vpscatterqd_avx512f(ZEXT832(local_48.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) +
                          auVar11._0_32_ * (undefined1  [32])0x8,uVar2,auVar7);
      vpscatterqd_avx512f(ZEXT832(local_48.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) +
                          auVar10._0_32_ * (undefined1  [32])0x8,uVar1,auVar6);
      vpscatterqd_avx512f(ZEXT832(local_48.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) + ZEXT832(4) +
                          auVar11._0_32_ * (undefined1  [32])0x8,uVar2,auVar9);
      vpscatterqd_avx512f(ZEXT832(local_48.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) + ZEXT832(4) +
                          auVar10._0_32_ * (undefined1  [32])0x8,uVar1,auVar8);
      auVar11 = vpaddq_avx512f(auVar11,auVar13);
      auVar10 = vpaddq_avx512f(auVar10,auVar13);
    } while (uVar3 != 0);
  }
  generateRoi(&local_48,x,y,width,height);
  if (local_48.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generateRoi( const std::vector < PenguinV_Image::Image > & image, std::vector < uint32_t > & x, std::vector < uint32_t > & y,
                      uint32_t & width, uint32_t & height )
    {
        std::vector < std::pair < uint32_t, uint32_t> > imageSize( image.size() );

        for( size_t i = 0; i < image.size(); ++i )
            imageSize[i] = std::pair < uint32_t, uint32_t >( image[i].width(), image[i].height() ) ;

        generateRoi( imageSize, x, y, width, height );
    }